

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

bool __thiscall
cmsys::SystemInformationImplementation::DoesCPUSupportFeature
          (SystemInformationImplementation *this,long dwFeature)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = (this->Features).HasMMX;
  if ((dwFeature & 1U) == 0) {
    bVar1 = 0;
  }
  bVar2 = 1;
  bVar3 = bVar1;
  if (((this->Features).ExtendedFeatures.HasMMXPlus & 1U) != 0) {
    bVar3 = bVar2;
  }
  if ((dwFeature & 2U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3;
  if (((this->Features).HasSSE & 1U) != 0) {
    bVar1 = bVar2;
  }
  if ((dwFeature & 4U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).HasSSEFP & 1U) != 0) {
    bVar3 = bVar2;
  }
  if ((dwFeature & 0x800U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3;
  if (((this->Features).ExtendedFeatures.HasSSEMMX & 1U) != 0) {
    bVar1 = bVar2;
  }
  if ((dwFeature & 0x1000U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).HasSSE2 & 1U) != 0) {
    bVar3 = bVar2;
  }
  if ((dwFeature & 8U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3;
  if (((this->Features).ExtendedFeatures.Has3DNow & 1U) != 0) {
    bVar1 = bVar2;
  }
  if ((dwFeature & 0x10U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).ExtendedFeatures.Has3DNowPlus & 1U) != 0) {
    bVar3 = bVar2;
  }
  if ((dwFeature & 0x20U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3;
  if (((this->Features).HasIA64 & 1U) != 0) {
    bVar1 = bVar2;
  }
  if ((dwFeature & 0x40U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).ExtendedFeatures.SupportsMP & 1U) != 0) {
    bVar3 = bVar2;
  }
  if (-1 < (char)dwFeature) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3;
  if (((this->Features).HasSerial & 1U) != 0) {
    bVar1 = bVar2;
  }
  if ((dwFeature & 0x200U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).HasAPIC & 1U) != 0) {
    bVar3 = bVar2;
  }
  if ((dwFeature & 0x400U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3;
  if (((this->Features).HasCMOV & 1U) != 0) {
    bVar1 = bVar2;
  }
  if ((dwFeature & 0x2000U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).HasMTRR & 1U) != 0) {
    bVar3 = bVar2;
  }
  if ((dwFeature & 0x4000U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar2;
  if ((this->Features).L1CacheSize == -1) {
    bVar1 = bVar3;
  }
  if (-1 < (short)dwFeature) {
    bVar1 = bVar3;
  }
  bVar3 = bVar2;
  if ((this->Features).L2CacheSize == -1) {
    bVar3 = bVar1;
  }
  if ((dwFeature & 0x10000U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar2;
  if ((this->Features).L3CacheSize == -1) {
    bVar1 = bVar3;
  }
  if ((dwFeature & 0x20000U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).HasACPI & 1U) != 0) {
    bVar3 = bVar2;
  }
  if ((dwFeature & 0x40000U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3;
  if (((this->Features).HasThermal & 1U) != 0) {
    bVar1 = bVar2;
  }
  if ((dwFeature & 0x80000U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).ExtendedFeatures.PowerManagement.HasTempSenseDiode & 1U) != 0) {
    bVar3 = bVar2;
  }
  if ((dwFeature & 0x100000U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar3;
  if (((this->Features).ExtendedFeatures.PowerManagement.HasFrequencyID & 1U) != 0) {
    bVar1 = bVar2;
  }
  if ((dwFeature & 0x200000U) == 0) {
    bVar1 = bVar3;
  }
  bVar3 = bVar1;
  if (((this->Features).ExtendedFeatures.PowerManagement.HasVoltageID & 1U) != 0) {
    bVar3 = 1;
  }
  if ((dwFeature & 0x400000U) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = 1;
  if (((this->Features).HasFPU & 1U) == 0) {
    bVar1 = bVar3;
  }
  if ((dwFeature & 0x800000U) == 0) {
    bVar1 = bVar3;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool SystemInformationImplementation::DoesCPUSupportFeature(
  long int dwFeature) const
{
  bool bHasFeature = false;

  // Check for MMX instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_MMX) != 0) &&
      this->Features.HasMMX)
    bHasFeature = true;

  // Check for MMX+ instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_MMX_PLUS) != 0) &&
      this->Features.ExtendedFeatures.HasMMXPlus)
    bHasFeature = true;

  // Check for SSE FP instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_SSE) != 0) &&
      this->Features.HasSSE)
    bHasFeature = true;

  // Check for SSE FP instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_SSE_FP) != 0) &&
      this->Features.HasSSEFP)
    bHasFeature = true;

  // Check for SSE MMX instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_SSE_MMX) != 0) &&
      this->Features.ExtendedFeatures.HasSSEMMX)
    bHasFeature = true;

  // Check for SSE2 instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_SSE2) != 0) &&
      this->Features.HasSSE2)
    bHasFeature = true;

  // Check for 3DNow! instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_AMD_3DNOW) != 0) &&
      this->Features.ExtendedFeatures.Has3DNow)
    bHasFeature = true;

  // Check for 3DNow+ instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_AMD_3DNOW_PLUS) != 0) &&
      this->Features.ExtendedFeatures.Has3DNowPlus)
    bHasFeature = true;

  // Check for IA64 instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_IA64) != 0) &&
      this->Features.HasIA64)
    bHasFeature = true;

  // Check for MP capable.
  if (((dwFeature & SystemInformation::CPU_FEATURE_MP_CAPABLE) != 0) &&
      this->Features.ExtendedFeatures.SupportsMP)
    bHasFeature = true;

  // Check for a serial number for the processor.
  if (((dwFeature & SystemInformation::CPU_FEATURE_SERIALNUMBER) != 0) &&
      this->Features.HasSerial)
    bHasFeature = true;

  // Check for a local APIC in the processor.
  if (((dwFeature & SystemInformation::CPU_FEATURE_APIC) != 0) &&
      this->Features.HasAPIC)
    bHasFeature = true;

  // Check for CMOV instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_CMOV) != 0) &&
      this->Features.HasCMOV)
    bHasFeature = true;

  // Check for MTRR instructions.
  if (((dwFeature & SystemInformation::CPU_FEATURE_MTRR) != 0) &&
      this->Features.HasMTRR)
    bHasFeature = true;

  // Check for L1 cache size.
  if (((dwFeature & SystemInformation::CPU_FEATURE_L1CACHE) != 0) &&
      (this->Features.L1CacheSize != -1))
    bHasFeature = true;

  // Check for L2 cache size.
  if (((dwFeature & SystemInformation::CPU_FEATURE_L2CACHE) != 0) &&
      (this->Features.L2CacheSize != -1))
    bHasFeature = true;

  // Check for L3 cache size.
  if (((dwFeature & SystemInformation::CPU_FEATURE_L3CACHE) != 0) &&
      (this->Features.L3CacheSize != -1))
    bHasFeature = true;

  // Check for ACPI capability.
  if (((dwFeature & SystemInformation::CPU_FEATURE_ACPI) != 0) &&
      this->Features.HasACPI)
    bHasFeature = true;

  // Check for thermal monitor support.
  if (((dwFeature & SystemInformation::CPU_FEATURE_THERMALMONITOR) != 0) &&
      this->Features.HasThermal)
    bHasFeature = true;

  // Check for temperature sensing diode support.
  if (((dwFeature & SystemInformation::CPU_FEATURE_TEMPSENSEDIODE) != 0) &&
      this->Features.ExtendedFeatures.PowerManagement.HasTempSenseDiode)
    bHasFeature = true;

  // Check for frequency ID support.
  if (((dwFeature & SystemInformation::CPU_FEATURE_FREQUENCYID) != 0) &&
      this->Features.ExtendedFeatures.PowerManagement.HasFrequencyID)
    bHasFeature = true;

  // Check for voltage ID support.
  if (((dwFeature & SystemInformation::CPU_FEATURE_VOLTAGEID_FREQUENCY) !=
       0) &&
      this->Features.ExtendedFeatures.PowerManagement.HasVoltageID)
    bHasFeature = true;

  // Check for FPU support.
  if (((dwFeature & SystemInformation::CPU_FEATURE_FPU) != 0) &&
      this->Features.HasFPU)
    bHasFeature = true;

  return bHasFeature;
}